

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>const&>
::
AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>const*,std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>>>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>>const&>
          *this,__normal_iterator<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                elem_first,
          __normal_iterator<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  pointer pcVar1;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_02;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  vector<char,_std::allocator<char>_> did_match;
  DummyMatchResultListener dummy;
  allocator_type local_99;
  vector<char,_std::allocator<char>_> local_98;
  string local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  MatchResultListener *local_50;
  size_t local_48;
  MatchResultListener local_40;
  
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)element_printouts;
  local_50 = listener;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(element_printouts,
                    (element_printouts->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  sVar6 = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00349ef0;
  local_58 = elem_last._M_current;
  if (elem_first._M_current != elem_last._M_current) {
    sVar6 = 0;
    value = extraout_RDX;
    do {
      local_48 = sVar6;
      if (local_50->stream_ != (ostream *)0x0) {
        PrintToString<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>
                  (&local_80,(testing *)elem_first._M_current,value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_60,&local_80);
        value = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                          local_80.field_2._M_allocated_capacity + 1);
          value = extraout_RDX_01;
        }
      }
      lVar2 = *(long *)(this + 0x28);
      if (*(long *)(this + 0x30) != lVar2) {
        lVar5 = 0;
        lVar4 = 0;
        do {
          local_80._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
               ::MatchAndExplain((MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                                  *)(lVar2 + lVar5),elem_first._M_current,&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_98,(char *)&local_80);
          lVar4 = lVar4 + 1;
          lVar2 = *(long *)(this + 0x28);
          lVar5 = lVar5 + 0x18;
          value = extraout_RDX_02;
        } while (lVar4 != (*(long *)(this + 0x30) - lVar2 >> 3) * -0x5555555555555555);
      }
      sVar6 = local_48 + 1;
      elem_first._M_current = elem_first._M_current + 1;
    } while (elem_first._M_current != local_58);
  }
  sVar3 = (*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 3) * -0x5555555555555555;
  __return_storage_ptr__->num_elements_ = sVar6;
  __return_storage_ptr__->num_matchers_ = sVar3;
  local_80._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->matched_,sVar3 * sVar6,(value_type *)&local_80,&local_99);
  if (sVar6 != 0) {
    sVar3 = 0;
    pcVar1 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (*(long *)(this + 0x30) != *(long *)(this + 0x28)) {
        lVar2 = 0;
        do {
          (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl
          .super__Vector_impl_data._M_start[lVar2 + __return_storage_ptr__->num_matchers_ * sVar3] =
               pcVar1[lVar2] != '\0';
          lVar2 = lVar2 + 1;
        } while (lVar2 != (*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 3) *
                          -0x5555555555555555);
        pcVar1 = pcVar1 + lVar2;
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar6);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }